

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O1

fdb_status
fdb_iterator_init(fdb_kvs_handle *handle,fdb_iterator **ptr_iterator,void *start_key,
                 size_t start_keylen,void *end_key,size_t end_keylen,fdb_iterator_opt_t opt)

{
  uint32_t *puVar1;
  ushort uVar2;
  fdb_kvs_handle *pfVar3;
  kvs_info *pkVar4;
  fdb_kvs_id_t fVar5;
  hbtrie *trie;
  filemgr *file;
  snap_handle *shandle;
  wal_iterator *pwVar6;
  long lVar7;
  bool bVar8;
  fdb_status fVar9;
  hbtrie_result hVar10;
  fdb_status fVar11;
  ulong uVar12;
  fdb_iterator *iterator;
  void *pvVar13;
  char *pcVar14;
  hbtrie_iterator *it;
  wal_item *pwVar15;
  undefined1 *puVar16;
  undefined8 uStack_110;
  undefined1 local_108 [8];
  wal_item query;
  wal_item_header query_key;
  
  puVar16 = local_108;
  if (handle == (fdb_kvs_handle *)0x0) {
    fVar9 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    fVar9 = FDB_RESULT_INVALID_ARGS;
    if (start_keylen < 0xff81) {
      if ((handle->kvs_config).custom_cmp == (fdb_custom_cmp_variable)0x0) {
        if (0xff80 < end_keylen) {
          return FDB_RESULT_INVALID_ARGS;
        }
      }
      else {
        uVar12 = (ulong)((handle->config).blocksize - 0x100);
        if (uVar12 < start_keylen) {
          return FDB_RESULT_INVALID_ARGS;
        }
        if (0xff80 < end_keylen || uVar12 < end_keylen) {
          return FDB_RESULT_INVALID_ARGS;
        }
      }
      if ((((opt & 4) == 0) || (start_keylen != 0 && start_key != (void *)0x0)) &&
         (((opt & 8) == 0 || (end_keylen != 0 && end_key != (void *)0x0)))) {
        if (handle->shandle == (snap_handle *)0x0) {
          uStack_110 = 0x12c9ce;
          fdb_check_file_reopen(handle,(file_status_t *)0x0);
          uStack_110 = 0x12c9d6;
          fdb_sync_db_header(handle);
        }
        uStack_110 = 0x12c9e5;
        iterator = (fdb_iterator *)calloc(1,0x98);
        if (handle->shandle == (snap_handle *)0x0) {
          uStack_110 = 0x12cac6;
          fVar9 = fdb_snapshot_open(handle,(fdb_kvs_handle **)iterator,0xffffffffffffffff);
          if (fVar9 != FDB_RESULT_SUCCESS) {
            uStack_110 = 0x12cae4;
            pcVar14 = _fdb_kvs_get_name(handle,handle->file);
            fdb_log_impl(&handle->log_callback,2,fVar9,
                         "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/iterator.cc"
                         ,"fdb_iterator_init",0x97,
                         "Failed to create an iterator instance due to the failure of open operation on the KV Store \'%s\' in a database file \'%s\'"
                         ,pcVar14,handle->file->filename);
            return fVar9;
          }
          bVar8 = false;
        }
        else {
          iterator->handle = handle;
          bVar8 = true;
        }
        iterator->snapshot_handle = bVar8;
        iterator->opt = opt;
        uStack_110 = 0x12ca12;
        pvVar13 = malloc(0xfff0);
        iterator->_key = pvVar13;
        pfVar3 = iterator->handle;
        uStack_110 = 0x12ca2b;
        memset(pvVar13,0,(ulong)(pfVar3->config).chunksize);
        iterator->_keylen = 0;
        iterator->_offset = 0xffffffffffffffff;
        iterator->hbtrie_iterator = (hbtrie_iterator *)0x0;
        iterator->seqtree_iterator = (btree_iterator *)0x0;
        iterator->seqtrie_iterator = (hbtrie_iterator *)0x0;
        pkVar4 = pfVar3->kvs;
        if (pkVar4 == (kvs_info *)0x0) {
          if (start_key == (void *)0x0) {
            iterator->start_key = (void *)0x0;
            (iterator->field_10).start_seqnum = 0;
          }
          else {
            uStack_110 = 0x12cb41;
            pvVar13 = malloc(start_keylen);
            iterator->start_key = pvVar13;
            uStack_110 = 0x12cb57;
            memcpy(pvVar13,start_key,start_keylen);
            (iterator->field_10).start_keylen = start_keylen;
          }
          if (end_key == (void *)0x0) {
            iterator->end_key = (void *)0x0;
            end_keylen = 0;
          }
          else {
            uStack_110 = 0x12cc6e;
            pvVar13 = malloc(end_keylen);
            iterator->end_key = pvVar13;
            uStack_110 = 0x12cc80;
            memcpy(pvVar13,end_key,end_keylen);
            puVar16 = local_108;
          }
        }
        else {
          uVar2 = (handle->config).chunksize;
          uVar12 = (ulong)uVar2;
          if (start_key == (void *)0x0) {
            lVar7 = -(ulong)(uVar2 + 0xf & 0xfffffff0);
            start_key = local_108 + lVar7;
            fVar5 = pkVar4->id;
            *(undefined8 *)(local_108 + lVar7 + -8) = 0x12cb7f;
            kvid2buf(uVar12,fVar5,start_key);
            start_keylen = uVar12;
          }
          else {
            lVar7 = -(uVar12 + start_keylen + 0xf & 0xfffffffffffffff0);
            puVar16 = local_108 + lVar7;
            fVar5 = pkVar4->id;
            *(undefined8 *)(local_108 + lVar7 + -8) = 0x12ca9b;
            kvid2buf(uVar12,fVar5,puVar16);
            *(undefined8 *)(local_108 + lVar7 + -8) = 0x12caab;
            memcpy(puVar16 + uVar12,start_key,start_keylen);
            start_keylen = uVar12 + start_keylen;
            start_key = puVar16;
          }
          if (end_key == (void *)0x0) {
            puVar16 = (undefined1 *)((long)start_key + -(ulong)(uVar2 + 0xf & 0xfffffff0));
            fVar5 = iterator->handle->kvs->id;
            *(undefined8 *)(puVar16 + -8) = 0x12cc0c;
            kvid2buf(uVar12,fVar5 + 1,puVar16);
            end_keylen = uVar12;
          }
          else {
            puVar16 = (undefined1 *)
                      ((long)start_key + -(uVar12 + end_keylen + 0xf & 0xfffffffffffffff0));
            fVar5 = iterator->handle->kvs->id;
            *(undefined8 *)(puVar16 + -8) = 0x12cbc5;
            kvid2buf(uVar12,fVar5,puVar16);
            *(undefined8 *)(puVar16 + -8) = 0x12cbd9;
            memcpy(puVar16 + uVar12,end_key,end_keylen);
            end_keylen = uVar12 + end_keylen;
          }
          *(undefined8 *)(puVar16 + -8) = 0x12cc14;
          pvVar13 = malloc(start_keylen);
          iterator->start_key = pvVar13;
          *(undefined8 *)(puVar16 + -8) = 0x12cc2e;
          memcpy(pvVar13,start_key,start_keylen);
          (iterator->field_10).start_keylen = start_keylen;
          *(undefined8 *)(puVar16 + -8) = 0x12cc3a;
          pvVar13 = malloc(end_keylen);
          iterator->end_key = pvVar13;
          *(undefined8 *)(puVar16 + -8) = 0x12cc4c;
          memcpy(pvVar13,puVar16,end_keylen);
        }
        (iterator->field_12).end_seqnum = end_keylen;
        *(undefined8 *)(puVar16 + -8) = 0x12cc9f;
        it = (hbtrie_iterator *)malloc(0x98);
        iterator->hbtrie_iterator = it;
        trie = iterator->handle->trie;
        *(undefined8 *)(puVar16 + -8) = 0x12ccb8;
        hVar10 = hbtrie_iterator_init(trie,it,start_key,start_keylen);
        if (hVar10 != HBTRIE_RESULT_SUCCESS) {
          *(code **)(puVar16 + -8) = fdb_iterator_next;
          __assert_fail("hr == HBTRIE_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/iterator.cc"
                        ,0xf0,
                        "fdb_status fdb_iterator_init(fdb_kvs_handle *, fdb_iterator **, const void *, size_t, const void *, size_t, fdb_iterator_opt_t)"
                       );
        }
        file = iterator->handle->file;
        shandle = iterator->handle->shandle;
        *(undefined8 *)(puVar16 + -8) = 0x12ccdf;
        wal_itr_init(file,shandle,true,&iterator->wal_itr);
        if ((undefined1 *)start_key == (undefined1 *)0x0) {
          pwVar6 = iterator->wal_itr;
          *(undefined8 *)(puVar16 + -8) = 0x12cd18;
          pwVar15 = wal_itr_first(pwVar6);
        }
        else {
          query.avl_seq.right = (avl_node *)((long)&query.field_12 + 0x10);
          pwVar6 = iterator->wal_itr;
          *(undefined8 *)(puVar16 + -8) = 0x12cd0d;
          pwVar15 = wal_itr_search_greater(pwVar6,(wal_item *)local_108);
        }
        iterator->tree_cursor = pwVar15;
        pwVar15 = iterator->tree_cursor;
        if (pwVar15 != (wal_item *)0x0) {
          iterator->tree_cursor_start = pwVar15;
        }
        iterator->tree_cursor_prev = pwVar15;
        iterator->direction = '\0';
        iterator->status = '\0';
        iterator->_dhandle = (docio_handle *)0x0;
        *ptr_iterator = iterator;
        puVar1 = &iterator->handle->num_iterators;
        *puVar1 = *puVar1 + 1;
        *(undefined8 *)(puVar16 + -8) = 0x12cd57;
        fVar11 = fdb_iterator_next(iterator);
        fVar9 = FDB_RESULT_SUCCESS;
        if (fVar11 == FDB_RESULT_FILE_CORRUPTION) {
          *(undefined8 *)(puVar16 + -8) = 0x12cd6b;
          fdb_iterator_close(iterator);
          fVar9 = FDB_RESULT_FILE_CORRUPTION;
        }
      }
    }
  }
  return fVar9;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_init(fdb_kvs_handle *handle,
                             fdb_iterator **ptr_iterator,
                             const void *start_key,
                             size_t start_keylen,
                             const void *end_key,
                             size_t end_keylen,
                             fdb_iterator_opt_t opt)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (start_keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
           (start_keylen > handle->config.blocksize - HBTRIE_HEADROOM ||
            end_keylen > handle->config.blocksize - HBTRIE_HEADROOM)) ||
        end_keylen > FDB_MAX_KEYLEN) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if ((opt & FDB_ITR_SKIP_MIN_KEY && (!start_key || !start_keylen)) ||
        (opt & FDB_ITR_SKIP_MAX_KEY && (!end_key || !end_keylen))) {
        return FDB_RESULT_INVALID_ARGS;
    }

    hbtrie_result hr;
    fdb_status fs;
    LATENCY_STAT_START();

    if (!handle->shandle) {
        // If compaction is already done before this line,
        // handle->file needs to be replaced with handle->new_file.
        fdb_check_file_reopen(handle, NULL);
        fdb_sync_db_header(handle);
    }

    fdb_iterator *iterator = (fdb_iterator *)calloc(1, sizeof(fdb_iterator));

    if (!handle->shandle) {
        // snapshot handle doesn't exist
        // open a new handle to make the iterator handle as a snapshot
        fs = fdb_snapshot_open(handle, &iterator->handle, FDB_SNAPSHOT_INMEM);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(&handle->log_callback, FDB_LOG_ERROR, fs,
                    "Failed to create an iterator instance due to the failure of "
                    "open operation on the KV Store '%s' in a database file '%s'",
                    _fdb_kvs_get_name(handle, handle->file),
                    handle->file->filename);
            return fs;
        }
        iterator->snapshot_handle = false;
    } else {
        // Snapshot handle exists
        // We don't need to open a new handle.. just point to the snapshot handle.
        iterator->handle = handle;
        iterator->snapshot_handle = true;
    }
    iterator->opt = opt;

    iterator->_key = (void*)malloc(FDB_MAX_KEYLEN_INTERNAL);
    // set to zero the first <chunksize> bytes
    memset(iterator->_key, 0x0, iterator->handle->config.chunksize);
    iterator->_keylen = 0;
    iterator->_offset = BLK_NOT_FOUND;
    iterator->hbtrie_iterator = NULL;
    iterator->seqtree_iterator = NULL;
    iterator->seqtrie_iterator = NULL;

    if (iterator->handle->kvs) {
        // multi KV instance mode .. prepend KV ID
        size_t size_chunk = handle->config.chunksize;
        uint8_t *start_key_temp, *end_key_temp;

        if (start_key == NULL) {
            start_key_temp = alca(uint8_t, size_chunk);
            kvid2buf(size_chunk, iterator->handle->kvs->id, start_key_temp);
            start_key = start_key_temp;
            start_keylen = size_chunk;
        } else {
            start_key_temp = alca(uint8_t, size_chunk + start_keylen);
            kvid2buf(size_chunk, iterator->handle->kvs->id, start_key_temp);
            memcpy(start_key_temp + size_chunk, start_key, start_keylen);
            start_key = start_key_temp;
            start_keylen += size_chunk;
        }

        if (end_key == NULL) {
            // set end_key as NULL key of the next KV ID.
            // NULL key doesn't actually exist so that the iterator ends
            // at the last key of the current KV ID.
            end_key_temp = alca(uint8_t, size_chunk);
            kvid2buf(size_chunk, iterator->handle->kvs->id+1, end_key_temp);
            end_key = end_key_temp;
            end_keylen = size_chunk;
        } else {
            end_key_temp = alca(uint8_t, size_chunk + end_keylen);
            kvid2buf(size_chunk, iterator->handle->kvs->id, end_key_temp);
            memcpy(end_key_temp + size_chunk, end_key, end_keylen);
            end_key = end_key_temp;
            end_keylen += size_chunk;
        }

        iterator->start_key = (void*)malloc(start_keylen);
        memcpy(iterator->start_key, start_key, start_keylen);
        iterator->start_keylen = start_keylen;

        iterator->end_key = (void*)malloc(end_keylen);
        memcpy(iterator->end_key, end_key, end_keylen);
        iterator->end_keylen = end_keylen;

    } else { // single KV instance mode
        if (start_key == NULL) {
            iterator->start_key = NULL;
            iterator->start_keylen = 0;
        } else {
            iterator->start_key = (void*)malloc(start_keylen);
            memcpy(iterator->start_key, start_key, start_keylen);
            iterator->start_keylen = start_keylen;
        }

        if (end_key == NULL) {
            iterator->end_key = NULL;
            end_keylen = 0;
        }else{
            iterator->end_key = (void*)malloc(end_keylen);
            memcpy(iterator->end_key, end_key, end_keylen);
        }
        iterator->end_keylen = end_keylen;
    }

    // create an iterator handle for hb-trie
    iterator->hbtrie_iterator = (struct hbtrie_iterator *)
                                malloc(sizeof(struct hbtrie_iterator));
    hr = hbtrie_iterator_init(iterator->handle->trie,
                              iterator->hbtrie_iterator,
                              (void *)start_key, start_keylen);
    assert(hr == HBTRIE_RESULT_SUCCESS);

    wal_itr_init(iterator->handle->file, iterator->handle->shandle, true,
                 &iterator->wal_itr);

    if (start_key) {
        struct wal_item query;
        struct wal_item_header query_key;
        query.header = &query_key;
        query_key.key = iterator->start_key;
        query_key.keylen = iterator->start_keylen;
        iterator->tree_cursor = wal_itr_search_greater(iterator->wal_itr,
                                                       &query);
    } else {
        iterator->tree_cursor = wal_itr_first(iterator->wal_itr);
    }
    // to know reverse iteration endpoint store the start cursor
    if (iterator->tree_cursor) {
        iterator->tree_cursor_start = iterator->tree_cursor;
    }
    iterator->tree_cursor_prev = iterator->tree_cursor;
    iterator->direction = FDB_ITR_DIR_NONE;
    iterator->status = FDB_ITR_IDX;
    iterator->_dhandle = NULL; // populated at the first iterator movement

    *ptr_iterator = iterator;

    ++iterator->handle->num_iterators; // Increment the iterator counter of the KV handle
    fs = fdb_iterator_next(iterator); // position cursor at first key
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_INIT);
    if (fs == FDB_RESULT_FILE_CORRUPTION) {
        fdb_iterator_close(iterator);
        return fs;
    }

    return FDB_RESULT_SUCCESS;
}